

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDB_DBIStream.cpp
# Opt level: O0

ErrorCode __thiscall PDB::DBIStream::HasValidImageSectionStream(DBIStream *this,RawFile *param_1)

{
  bool bVar1;
  DebugHeader local_46;
  DebugHeader *debugHeader;
  RawFile *pRStack_20;
  uint32_t debugHeaderOffset;
  RawFile *param_1_local;
  DBIStream *this_local;
  
  pRStack_20 = param_1;
  param_1_local = (RawFile *)this;
  bVar1 = anon_unknown.dwarf_35d95::HasDebugHeaderSubstream(&this->m_header);
  if (bVar1) {
    debugHeader._4_4_ = anon_unknown.dwarf_35d95::GetDebugHeaderSubstreamOffset(&this->m_header);
    DirectMSFStream::ReadAtOffset<PDB::DBI::DebugHeader>
              (&local_46,&this->m_stream,(ulong)debugHeader._4_4_);
    if (local_46.sectionHeaderStreamIndex == 0xffff) {
      this_local._4_4_ = InvalidStreamIndex;
    }
    else {
      this_local._4_4_ = Success;
    }
  }
  else {
    this_local._4_4_ = InvalidStreamIndex;
  }
  return this_local._4_4_;
}

Assistant:

PDB_NO_DISCARD PDB::ErrorCode PDB::DBIStream::HasValidImageSectionStream(const RawFile& /* file */) const PDB_NO_EXCEPT
{
	// the debug header stream is optional. if it's not there, we can't get the image section stream either.
	if (!HasDebugHeaderSubstream(m_header))
	{
		return ErrorCode::InvalidStreamIndex;
	}

	// find the debug header sub-stream
	const uint32_t debugHeaderOffset = GetDebugHeaderSubstreamOffset(m_header);
	const DBI::DebugHeader& debugHeader = m_stream.ReadAtOffset<DBI::DebugHeader>(debugHeaderOffset);

	if (debugHeader.sectionHeaderStreamIndex == DBI::DebugHeader::InvalidStreamIndex)
	{
		return ErrorCode::InvalidStreamIndex;
	}

	return ErrorCode::Success;
}